

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

FaceHandle __thiscall OpenMesh::PolyConnectivity::remove_edge(PolyConnectivity *this,EdgeHandle _eh)

{
  bool bVar1;
  HalfedgeHandle _heh;
  HalfedgeHandle _heh_00;
  HalfedgeHandle _nheh;
  HalfedgeHandle _nheh_00;
  value_type _heh_01;
  StatusInfo *pSVar2;
  bool local_ed;
  undefined1 local_d8 [8];
  FaceHalfedgeIter fh_it;
  BaseHandle local_b0;
  BaseHandle local_ac;
  BaseHandle local_a8;
  BaseHandle local_a4;
  BaseHandle local_a0;
  BaseHandle local_9c;
  BaseHandle local_98;
  BaseHandle local_94;
  BaseHandle local_90;
  BaseHandle local_8c;
  BaseHandle local_88;
  BaseHandle local_84;
  BaseHandle local_80;
  BaseHandle local_7c;
  BaseHandle local_78;
  BaseHandle local_74;
  VertexHandle vh1;
  VertexHandle vh0;
  HalfedgeHandle next_heh1;
  HalfedgeHandle next_heh0;
  HalfedgeHandle prev_heh1;
  HalfedgeHandle prev_heh0;
  FaceHandle del_fh;
  BaseHandle local_2c;
  int local_28;
  HalfedgeHandle heh1;
  HalfedgeHandle heh0;
  PolyConnectivity *this_local;
  EdgeHandle _eh_local;
  FaceHandle rem_fh;
  
  this_local._0_4_ = _eh.super_BaseHandle.idx_;
  pSVar2 = ArrayKernel::status(&this->super_ArrayKernel,_eh);
  bVar1 = Attributes::StatusInfo::deleted(pSVar2);
  local_ed = false;
  if (!bVar1) {
    local_ed = is_simple_link(this,(EdgeHandle)this_local._0_4_);
  }
  if (local_ed == false) {
    __assert_fail("!status(_eh).deleted() && is_simple_link(_eh)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x362,
                  "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::remove_edge(EdgeHandle)"
                 );
  }
  local_28 = this_local._0_4_;
  heh1 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,(EdgeHandle)this_local._0_4_,0);
  local_2c.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,this_local._0_4_,1);
  this_local._4_4_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,heh1);
  prev_heh0.super_BaseHandle.idx_ =
       (BaseHandle)ArrayKernel::face_handle(&this->super_ArrayKernel,(HalfedgeHandle)local_2c.idx_);
  bVar1 = BaseHandle::is_valid(&prev_heh0.super_BaseHandle);
  if (!bVar1) {
    std::swap<OpenMesh::FaceHandle>((FaceHandle *)&prev_heh0,(FaceHandle *)((long)&this_local + 4));
  }
  bVar1 = BaseHandle::is_valid(&prev_heh0.super_BaseHandle);
  if (bVar1) {
    _heh = ArrayKernel::prev_halfedge_handle(&this->super_ArrayKernel,heh1);
    _heh_00 = ArrayKernel::prev_halfedge_handle
                        (&this->super_ArrayKernel,(HalfedgeHandle)local_2c.idx_);
    _nheh = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,heh1);
    _nheh_00 = ArrayKernel::next_halfedge_handle
                         (&this->super_ArrayKernel,(HalfedgeHandle)local_2c.idx_);
    ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh,_nheh_00);
    ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh_00,_nheh);
    local_74 = heh1.super_BaseHandle.idx_;
    vh1 = ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,heh1);
    local_7c.idx_ = local_2c.idx_;
    local_78.idx_ = (int)ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,local_2c.idx_);
    local_84 = vh1.super_BaseHandle.idx_;
    local_80.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,vh1);
    bVar1 = BaseHandle::operator==(&local_80,&local_2c);
    if (bVar1) {
      local_88 = vh1.super_BaseHandle.idx_;
      local_8c = _nheh.super_BaseHandle.idx_;
      ArrayKernel::set_halfedge_handle(&this->super_ArrayKernel,vh1,_nheh);
    }
    local_94.idx_ = local_78.idx_;
    local_90.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,local_78.idx_);
    bVar1 = BaseHandle::operator==(&local_90,&heh1.super_BaseHandle);
    if (bVar1) {
      local_98.idx_ = local_78.idx_;
      local_9c = _nheh_00.super_BaseHandle.idx_;
      ArrayKernel::set_halfedge_handle
                (&this->super_ArrayKernel,(VertexHandle)local_78.idx_,_nheh_00);
    }
    local_a4.idx_ = this_local._4_4_;
    local_a0.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,this_local._4_4_);
    bVar1 = BaseHandle::operator==(&local_a0,&heh1.super_BaseHandle);
    if (bVar1) {
      local_a8.idx_ = this_local._4_4_;
      local_ac = _heh_00.super_BaseHandle.idx_;
      ArrayKernel::set_halfedge_handle
                (&this->super_ArrayKernel,(FaceHandle)this_local._4_4_,_heh_00);
    }
    else {
      local_b0.idx_ = (int)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,this_local._4_4_);
      bVar1 = BaseHandle::operator==(&local_b0,&local_2c);
      if (bVar1) {
        fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = _heh;
        ArrayKernel::set_halfedge_handle(&this->super_ArrayKernel,(FaceHandle)this_local._4_4_,_heh)
        ;
      }
    }
    fh_iter((FaceHalfedgeIter *)local_d8,this,(FaceHandle)this_local._4_4_);
    while (bVar1 = Iterators::
                   GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                   ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                               *)local_d8), bVar1) {
      _heh_01 = Iterators::
                GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                             *)local_d8);
      ArrayKernel::set_face_handle
                (&this->super_ArrayKernel,(HalfedgeHandle)_heh_01.super_BaseHandle.idx_,
                 (FaceHandle)this_local._4_4_);
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                    *)local_d8);
    }
    pSVar2 = ArrayKernel::status(&this->super_ArrayKernel,(EdgeHandle)this_local._0_4_);
    Attributes::StatusInfo::set_deleted(pSVar2,true);
    pSVar2 = ArrayKernel::status(&this->super_ArrayKernel,
                                 (FaceHandle)prev_heh0.super_BaseHandle.idx_);
    Attributes::StatusInfo::set_deleted(pSVar2,true);
    return (BaseHandle)(BaseHandle)this_local._4_4_;
  }
  __assert_fail("del_fh.is_valid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                ,0x36d,
                "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::remove_edge(EdgeHandle)");
}

Assistant:

PolyConnectivity::FaceHandle 
PolyConnectivity::remove_edge(EdgeHandle _eh)
{
  //don't allow "dangling" vertices and edges
  assert(!status(_eh).deleted() && is_simple_link(_eh));
  
  HalfedgeHandle heh0 = halfedge_handle(_eh, 0);
  HalfedgeHandle heh1 = halfedge_handle(_eh, 1);
  
  //deal with the faces
  FaceHandle rem_fh = face_handle(heh0), del_fh = face_handle(heh1);
  if (!del_fh.is_valid())
  {//boundary case - we must delete the rem_fh
    std::swap(del_fh, rem_fh);
  }
  assert(del_fh.is_valid());
/*  for (FaceHalfedgeIter fh_it = fh_iter(del_fh); fh_it; ++fh_it)
  {//set the face handle of the halfedges of del_fh to point to rem_fh
    set_face_handle(fh_it, rem_fh);  
  } */
  //fix the halfedge relations
  HalfedgeHandle prev_heh0 = prev_halfedge_handle(heh0);
  HalfedgeHandle prev_heh1 = prev_halfedge_handle(heh1);

  HalfedgeHandle next_heh0 = next_halfedge_handle(heh0);
  HalfedgeHandle next_heh1 = next_halfedge_handle(heh1);
  
  set_next_halfedge_handle(prev_heh0, next_heh1);
  set_next_halfedge_handle(prev_heh1, next_heh0);
  //correct outgoing vertex handles for the _eh vertices (if needed)
  VertexHandle vh0 = to_vertex_handle(heh0);
  VertexHandle vh1 = to_vertex_handle(heh1);
  
  if (halfedge_handle(vh0) == heh1)
  {
    set_halfedge_handle(vh0, next_heh0);
  }
  if (halfedge_handle(vh1) == heh0)
  {
    set_halfedge_handle(vh1, next_heh1);
  }
  
  //correct the hafledge handle of rem_fh if needed and preserve its first vertex
  if (halfedge_handle(rem_fh) == heh0)
  {//rem_fh is the face at heh0
    set_halfedge_handle(rem_fh, prev_heh1);
  }
  else if (halfedge_handle(rem_fh) == heh1)
  {//rem_fh is the face at heh1
    set_halfedge_handle(rem_fh, prev_heh0);
  }
  for (FaceHalfedgeIter fh_it = fh_iter(rem_fh); fh_it.is_valid(); ++fh_it)
  {//set the face handle of the halfedges of del_fh to point to rem_fh
    set_face_handle(*fh_it, rem_fh);
  } 
  
  status(_eh).set_deleted(true);  
  status(del_fh).set_deleted(true);  
  return rem_fh;//returns the remaining face handle
}